

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O2

void chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChMaterialShellANCF> *my_material,
               vector<double,_std::allocator<double>_> *node_ave_area,
               vector<int,_std::allocator<int>_> *Boundary_nodes,ChVector<double> *pos_transform,
               ChMatrix33<double> rot_transform,double scaleFactor,bool printNodes,
               bool printElements)

{
  size_type __new_size;
  undefined1 *puVar1;
  _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
  *p_Var2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int *piVar6;
  element_type *peVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  double *pdVar11;
  ChMesh *pCVar12;
  element_type *peVar13;
  pointer pdVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  _Alloc_hider _Var21;
  bool bVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  uint uVar28;
  istream *piVar29;
  Scalar *pSVar30;
  ChLog *pCVar31;
  Scalar *pSVar32;
  ChStreamOutAscii *pCVar33;
  ostream *poVar34;
  ChException *pCVar35;
  _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
  *p_Var36;
  long lVar37;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  uint uVar38;
  _Alloc_hider this;
  ulong uVar39;
  size_type sVar40;
  shared_ptr<chrono::fea::ChMesh> *psVar41;
  int i;
  size_type sVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  string token;
  uint local_8ac;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  elementsVector;
  string line;
  undefined1 local_848 [16];
  double local_838;
  undefined1 local_828 [16];
  double local_818;
  double local_808;
  shared_ptr<chrono::fea::ChMesh> *local_800;
  vector<int,_std::allocator<int>_> num_Normals;
  double local_7c8;
  double dStack_7c0;
  vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> Normals;
  ChMatrixNM<double,_1,_6> BoundingBox;
  ChVector<double> local_768;
  double local_748;
  vector<double,_std::allocator<double>_> *local_740;
  shared_ptr<chrono::fea::ChNodeFEAxyzD> node;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elementsdxdy;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  nodesVector;
  shared_ptr<chrono::ChNodeBase> local_6a0;
  shared_ptr<chrono::ChNodeBase> local_690;
  ChMatrixDynamic<double> nodesXYZ;
  __shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2> local_650 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_648;
  shared_ptr<chrono::ChNodeBase> local_640;
  shared_ptr<chrono::ChNodeBase> local_630;
  __shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2> local_620 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_618;
  ChMatrixDynamic<int> NumBEdges;
  double local_5d8;
  double dStack_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  istringstream stoken;
  undefined4 uStack_534;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_530;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_528 [23];
  istringstream ss;
  undefined4 uStack_3b4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_3b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a8 [23];
  ifstream fin;
  undefined4 uStack_234;
  int aiStack_218 [122];
  
  local_800 = mesh;
  local_740 = node_ave_area;
  uVar23 = (*(((mesh->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3c])();
  printf("Current number of nodes in mesh is %d \n",(ulong)uVar23);
  _ss = 4;
  _fin = 1;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&nodesXYZ,(int *)&fin,(int *)&ss);
  _ss = 3;
  _fin = 1;
  Eigen::Matrix<int,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<int,_1,_1,1,_1,_1> *)&NumBEdges,(int *)&fin,(int *)&ss);
  Normals.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_818 = 0.0;
  local_838 = 0.0;
  nodesVector.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  elementsVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  elementsdxdy.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Normals.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  Normals.super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_828 = ZEXT816(0);
  local_848 = ZEXT816(0);
  nodesVector.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  nodesVector.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elementsVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elementsVector.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  elementsdxdy.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  elementsdxdy.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  Eigen::DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_> *)&BoundingBox);
  std::ifstream::ifstream(&fin,filename,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(CONCAT44(uStack_234,_fin) + -0x18)) != 0) {
    pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string((string *)&stoken,filename,(allocator *)&line);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                   "ERROR opening Mesh file: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&stoken);
    std::operator+(&local_558,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,"\n");
    ChException::ChException(pCVar35,&local_558);
    __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
  }
  line._M_dataplus._M_p = (pointer)&line.field_2;
  local_8ac = 0;
  uVar24 = 0;
  iVar27 = 0;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  do {
    __it._M_current = (char *)&line;
    piVar29 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&fin,(string *)__it._M_current);
    _Var21 = line._M_dataplus;
    if (((byte)piVar29[*(long *)(*(long *)piVar29 + -0x18) + 0x20] & 5) != 0) {
      printf("Mesh Bounding box is x [%f %f %f %f %f %f]\n",
             BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
             m_data.array[0],
             BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
             m_data.array[1],
             BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
             m_data.array[2],
             BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
             m_data.array[3],
             BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
             m_data.array[4],
             BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
             m_data.array[5]);
      pCVar31 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar31->super_ChStreamOutAscii,
                 "-----------------------------------------------------------\n\n");
      lVar37 = 0;
      psVar41 = local_800;
      uVar28 = uVar23;
      for (uVar39 = 0; (~((int)uVar24 >> 0x1f) & uVar24) * 2 != uVar39; uVar39 = uVar39 + 2) {
        dVar43 = 1.0 / (double)*(int *)((long)num_Normals.
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data._M_start + uVar39 * 2);
        pdVar11 = (double *)
                  ((long)(Normals.
                          super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar37);
        _ss = (pointer)(dVar43 * *pdVar11);
        _Stack_3b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(dVar43 * pdVar11[1]);
        local_3a8[0]._0_8_ =
             dVar43 * *(double *)
                       ((long)(Normals.
                               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar37 + 0x10);
        dVar43 = ChVector<double>::Length
                           ((ChVector<double> *)
                            ((long)(Normals.
                                    super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar37));
        *(double *)
         ((long)(local_740->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start + uVar39 * 4 + (long)(int)uVar23 * 8) =
             dVar43 * 0.25;
        if (*(int *)((long)num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + uVar39 * 2) < 3) {
          _stoken = uVar28;
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(Boundary_nodes,(int *)&stoken);
        }
        ChVector<double>::Normalize((ChVector<double> *)&ss);
        peVar7 = (&((nodesVector.
                     super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr)[uVar39];
        _stoken = *(pointer *)&(peVar7->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
        _Stack_530._M_pi =
             *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
              &(peVar7->super_ChNodeFEAxyz).field_0x28;
        local_528[0]._0_8_ = *(undefined8 *)&(peVar7->super_ChNodeFEAxyz).field_0x30;
        std::
        make_shared<chrono::fea::ChNodeFEAxyzD,chrono::ChVector<double>&,chrono::ChVector<double>&>
                  ((ChVector<double> *)&token,(ChVector<double> *)&stoken);
        (**(code **)(*(long *)token._M_dataplus._M_p + 0x50))(0);
        pCVar12 = (psVar41->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        std::__shared_ptr<chrono::fea::ChNodeFEAbase,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::fea::ChNodeFEAxyzD,void>
                  (local_620,
                   (__shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2> *)&token);
        ChMesh::AddNode(pCVar12,(shared_ptr<chrono::fea::ChNodeFEAbase> *)local_620);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_618);
        psVar41 = local_800;
        if (rot_transform.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1].
            _0_1_ != '\0') {
          pCVar31 = GetLog();
          pCVar33 = ChStreamOutAscii::operator<<
                              (&pCVar31->super_ChStreamOutAscii,
                               *(double *)(token._M_dataplus._M_p + 0x20));
          pCVar33 = ChStreamOutAscii::operator<<(pCVar33,"  ");
          pCVar33 = ChStreamOutAscii::operator<<(pCVar33,*(double *)(token._M_dataplus._M_p + 0x28))
          ;
          pCVar33 = ChStreamOutAscii::operator<<(pCVar33,"  ");
          pCVar33 = ChStreamOutAscii::operator<<(pCVar33,*(double *)(token._M_dataplus._M_p + 0x30))
          ;
          ChStreamOutAscii::operator<<(pCVar33,"\n");
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&token._M_string_length);
        lVar37 = lVar37 + 0x18;
        uVar28 = uVar28 + 1;
      }
      pCVar31 = GetLog();
      ChStreamOutAscii::operator<<
                (&pCVar31->super_ChStreamOutAscii,
                 "-----------------------------------------------------------\n");
      iVar27 = uVar23 - 1;
      for (uVar39 = 0; uVar39 != (~((int)local_8ac >> 0x1f) & local_8ac); uVar39 = uVar39 + 1) {
        chrono_types::make_shared<chrono::fea::ChElementShellANCF_3423,_0>();
        _Var21._M_p = _ss;
        psVar41 = local_800;
        peVar13 = (local_800->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        (*(peVar13->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                  (&stoken,peVar13,
                   (ulong)(uint)(*elementsVector.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + iVar27));
        std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzD,chrono::ChNodeBase>(&local_690);
        peVar13 = (psVar41->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        (*(peVar13->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                  (&token,peVar13,
                   (ulong)(uint)(elementsVector.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[1] + iVar27));
        std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzD,chrono::ChNodeBase>(&local_6a0);
        peVar13 = (psVar41->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        (*(peVar13->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                  (&local_768,peVar13,
                   (ulong)(uint)(elementsVector.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[2] + iVar27));
        std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzD,chrono::ChNodeBase>(&local_630);
        peVar13 = (psVar41->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        (*(peVar13->super_ChIndexedNodes).super_ChPhysicsItem.super_ChObj._vptr_ChObj[0x3d])
                  (&node,peVar13,
                   (ulong)(uint)(elementsVector.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[3] + iVar27));
        std::dynamic_pointer_cast<chrono::fea::ChNodeFEAxyzD,chrono::ChNodeBase>(&local_640);
        ChElementShellANCF_3423::SetNodes
                  ((ChElementShellANCF_3423 *)_Var21._M_p,
                   (shared_ptr<chrono::fea::ChNodeFEAxyzD> *)&local_690,
                   (shared_ptr<chrono::fea::ChNodeFEAxyzD> *)&local_6a0,
                   (shared_ptr<chrono::fea::ChNodeFEAxyzD> *)&local_630,
                   (shared_ptr<chrono::fea::ChNodeFEAxyzD> *)&local_640);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_640.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&node.super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_630.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_768.m_data + 1));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6a0.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&token._M_string_length);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_690.super___shared_ptr<chrono::ChNodeBase,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_530);
        pdVar14 = elementsdxdy.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar39].
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        dVar43 = pdVar14[1];
        *(double *)(_ss + 0x90) = *pdVar14;
        *(double *)(_ss + 0x98) = dVar43;
        pCVar12 = (local_800->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr;
        std::__shared_ptr<chrono::fea::ChElementBase,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<chrono::fea::ChElementShellANCF_3423,void>
                  (local_650,
                   (__shared_ptr<chrono::fea::ChElementShellANCF_3423,_(__gnu_cxx::_Lock_policy)2> *
                   )&ss);
        ChMesh::AddElement(pCVar12,(shared_ptr<chrono::fea::ChElementBase> *)local_650);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_648);
        if (rot_transform.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2].
            _0_1_ != '\0') {
          poVar34 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar39);
          std::operator<<(poVar34," ");
          for (lVar37 = 0; lVar37 != 4; lVar37 = lVar37 + 1) {
            poVar34 = (ostream *)
                      std::ostream::operator<<
                                (&std::cout,
                                 elementsVector.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar39].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar37]);
            std::operator<<(poVar34," ");
          }
          std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_3b0);
      }
      std::__cxx11::string::~string((string *)&line);
      std::ifstream::~ifstream(&fin);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&elementsdxdy);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&elementsVector);
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
      ::~vector(&nodesVector);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&num_Normals.super__Vector_base<int,_std::allocator<int>_>);
      std::_Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::
      ~_Vector_base(&Normals.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                   );
      Eigen::internal::handmade_aligned_free
                (NumBEdges.super_PlainObjectBase<Eigen::Matrix<int,__1,__1,_1,__1,__1>_>.m_storage.
                 m_data);
      Eigen::internal::handmade_aligned_free
                (nodesXYZ.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage
                 .m_data);
      return;
    }
    p_Var2 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
              *)(line._M_dataplus._M_p + line._M_string_length);
    this = line._M_dataplus;
    sVar40 = line._M_string_length;
    for (lVar37 = (long)line._M_string_length >> 2;
        p_Var36 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                   *)this._M_p, 0 < lVar37; lVar37 = lVar37 + -1) {
      bVar22 = __gnu_cxx::__ops::
               _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::$_0>
               ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                             *)this._M_p,__it);
      if (bVar22) goto LAB_00b41248;
      bVar22 = __gnu_cxx::__ops::
               _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::$_0>
               ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                             *)this._M_p + 1,__it);
      p_Var36 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                 *)this._M_p + 1;
      if (bVar22) goto LAB_00b41248;
      bVar22 = __gnu_cxx::__ops::
               _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::$_0>
               ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                             *)this._M_p + 2,__it);
      p_Var36 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                 *)this._M_p + 2;
      if (bVar22) goto LAB_00b41248;
      bVar22 = __gnu_cxx::__ops::
               _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::$_0>
               ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                             *)this._M_p + 3,__it);
      p_Var36 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                 *)this._M_p + 3;
      if (bVar22) goto LAB_00b41248;
      this._M_p = this._M_p + 4;
      sVar40 = sVar40 - 4;
    }
    if (sVar40 == 1) {
LAB_00b412b3:
      bVar22 = __gnu_cxx::__ops::
               _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::$_0>
               ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                             *)this._M_p,__it);
      p_Var36 = p_Var2;
      if (bVar22) {
        p_Var36 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                   *)this._M_p;
      }
    }
    else if (sVar40 == 2) {
LAB_00b4128d:
      bVar22 = __gnu_cxx::__ops::
               _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::$_0>
               ::operator()(p_Var36,__it);
      if (!bVar22) {
        this._M_p = (pointer)(p_Var36 + 1);
        goto LAB_00b412b3;
      }
    }
    else {
      p_Var36 = p_Var2;
      if ((sVar40 == 3) &&
         (bVar22 = __gnu_cxx::__ops::
                   _Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::$_0>
                   ::operator()((_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                                 *)this._M_p,__it),
         p_Var36 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                    *)this._M_p, !bVar22)) {
        p_Var36 = (_Iter_pred<chrono::fea::ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<chrono::fea::ChMesh>,char_const*,std::shared_ptr<chrono::fea::ChMaterialShellANCF>,std::vector<double,std::allocator<double>>&,std::vector<int,std::allocator<int>>&,chrono::ChVector<double>,chrono::ChMatrix33<double>,double,bool,bool)::__0>
                   *)this._M_p + 1;
        goto LAB_00b4128d;
      }
    }
LAB_00b41248:
    std::__cxx11::string::erase(&line,_Var21._M_p,p_Var36);
    if (*line._M_dataplus._M_p != '\0') {
      lVar37 = std::__cxx11::string::find((char *)&line,0xe8d803);
      iVar25 = iVar27;
      if (lVar37 == 0) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fin,(string *)&line);
        uVar24 = atoi(line._M_dataplus._M_p);
        printf("Found  %d nodes\n",(ulong)uVar24);
        pCVar31 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar31->super_ChStreamOutAscii,"Parsing information from \"Vertices\" \n");
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fin,(string *)&line);
        std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
                  (&Normals,(long)(int)uVar24);
        std::vector<double,_std::allocator<double>_>::resize(local_740,(long)(int)(uVar24 + uVar23))
        ;
        std::vector<int,_std::allocator<int>_>::resize(&num_Normals,(long)(int)uVar24);
        uVar28 = ~((int)uVar24 >> 0x1f) & uVar24;
        local_808 = (double)(ulong)uVar28;
        iVar25 = iVar27 + uVar28;
        for (iVar26 = 0; iVar26 != local_808._0_4_; iVar26 = iVar26 + 1) {
          token._M_dataplus._M_p = (pointer)&token.field_2;
          token._M_string_length = 0;
          token.field_2._M_local_buf[0] = '\0';
          std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
          for (uVar39 = 0;
              (piVar29 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)&ss,(string *)&token,' '),
              ((byte)piVar29[*(long *)(*(long *)piVar29 + -0x18) + 0x20] & 5) == 0 &&
              (uVar39 < 0x14)); uVar39 = uVar39 + 1) {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&stoken,(string *)&token,_S_in);
            Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&nodesXYZ,0,
                       uVar39);
            std::istream::_M_extract<double>((double *)&stoken);
            pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::
                      operator()((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                                 &nodesXYZ,0,uVar39);
            *pSVar30 = scaleFactor * *pSVar30;
            std::__cxx11::istringstream::~istringstream((istringstream *)&stoken);
          }
          pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                               &nodesXYZ,0,0);
          dVar43 = *pSVar30;
          pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                               &nodesXYZ,0,1);
          dVar44 = *pSVar30;
          pSVar30 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)
                               &nodesXYZ,0,2);
          dVar45 = *pSVar30;
          local_768.m_data[0] = dVar43;
          local_768.m_data[1] = dVar44;
          local_768.m_data[2] = dVar45;
          ChMatrix33<double>::operator*
                    ((ChMatrix33<double> *)
                     rot_transform.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[0],&local_768);
          local_768.m_data[0] = (double)_stoken + pos_transform->m_data[0];
          local_768.m_data[1] = (double)_Stack_530._M_pi + pos_transform->m_data[1];
          local_768.m_data[2] = (double)local_528[0]._0_8_ + pos_transform->m_data[2];
          _stoken = &DAT_3ff0000000000000;
          _Stack_530._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_3ff0000000000000;
          local_528[0]._M_allocated_capacity = 1.0;
          std::
          make_shared<chrono::fea::ChNodeFEAxyzD,chrono::ChVector<double>&,chrono::ChVector<double>>
                    ((ChVector<double> *)&node,&local_768);
          std::
          vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
          ::push_back(&nodesVector,(value_type *)&node);
          if ((dVar43 < BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                        m_storage.m_data.array[0]) || (iVar27 == 0)) {
            BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[0] = dVar43;
          }
          if ((BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
               m_data.array[1] < dVar43) || (iVar27 == 0)) {
            BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[1] = dVar43;
          }
          if ((dVar44 < BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                        m_storage.m_data.array[2]) || (iVar27 == 0)) {
            BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[2] = dVar44;
          }
          if ((BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
               m_data.array[3] < dVar44) || (iVar27 == 0)) {
            BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[3] = dVar44;
          }
          if ((dVar45 < BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.
                        m_storage.m_data.array[4]) || (iVar27 == 0)) {
            BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[4] = dVar45;
          }
          if ((BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
               m_data.array[5] < dVar45) || (iVar27 == 0)) {
            BoundingBox.super_PlainObjectBase<Eigen::Matrix<double,_1,_6,_1,_1,_6>_>.m_storage.
            m_data.array[5] = dVar45;
          }
          if (uVar39 != 4) {
            pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,
                           "ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n",
                           &line);
            std::operator+(&local_578,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,"\n");
            ChException::ChException(pCVar35,&local_578);
            __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&fin,(string *)&line);
          iVar27 = iVar27 + 1;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&node.
                      super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
          std::__cxx11::string::~string((string *)&token);
        }
      }
      iVar27 = iVar25;
      lVar37 = std::__cxx11::string::find((char *)&line,0xf4a214);
      if (lVar37 == 0) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fin,(string *)&line);
        uVar28 = atoi(line._M_dataplus._M_p);
        printf("Found %d Edges.\n",(ulong)uVar28);
        pCVar31 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar31->super_ChStreamOutAscii,"Parsing edges from \"Edges\" \n");
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fin,(string *)&line);
        for (uVar38 = 0; uVar38 != (~((int)uVar28 >> 0x1f) & uVar28); uVar38 = uVar38 + 1) {
          token._M_dataplus._M_p = (pointer)&token.field_2;
          token._M_string_length = 0;
          token.field_2._M_local_buf[0] = '\0';
          std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
          for (uVar39 = 0;
              (piVar29 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)&ss,(string *)&token,' '),
              ((byte)piVar29[*(long *)(*(long *)piVar29 + -0x18) + 0x20] & 5) == 0 &&
              (uVar39 < 0x14)); uVar39 = uVar39 + 1) {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&stoken,(string *)&token,_S_in);
            pSVar32 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<int,__1,__1,_1,__1,__1>,_1> *)
                                 &NumBEdges,0,uVar39);
            std::istream::operator>>((istringstream *)&stoken,pSVar32);
            std::__cxx11::istringstream::~istringstream((istringstream *)&stoken);
          }
          if (uVar39 != 3) {
            pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,"ERROR in .mesh file, Edges require 3 node IDs, see line:\n",
                           &line);
            std::operator+(&local_598,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,"\n");
            ChException::ChException(pCVar35,&local_598);
            __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&fin,(string *)&line);
          std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
          std::__cxx11::string::~string((string *)&token);
        }
      }
      lVar37 = std::__cxx11::string::find((char *)&line,0xe8d8ee);
      if (lVar37 == 0) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fin,(string *)&line);
        local_8ac = atoi(line._M_dataplus._M_p);
        printf("Found %d elements.\n",(ulong)local_8ac);
        pCVar31 = GetLog();
        ChStreamOutAscii::operator<<
                  (&pCVar31->super_ChStreamOutAscii,"Parsing nodeset from \"Quadrilaterals\" \n");
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&fin,(string *)&line);
        sVar42 = 0;
        while (sVar42 != (~((int)local_8ac >> 0x1f) & local_8ac)) {
          token._M_dataplus._M_p = (pointer)&token.field_2;
          token._M_string_length = 0;
          token.field_2._M_local_buf[0] = '\0';
          std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&line,_S_in);
          __new_size = sVar42 + 1;
          std::
          vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
          ::resize(&elementsVector,__new_size);
          std::vector<int,_std::allocator<int>_>::resize
                    (elementsVector.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + sVar42,5);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::resize(&elementsdxdy,__new_size);
          std::vector<double,_std::allocator<double>_>::resize
                    (elementsdxdy.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + sVar42,2);
          lVar37 = 0;
          for (uVar39 = 0;
              (piVar29 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                   ((istream *)&ss,(string *)&token,' '),
              ((byte)piVar29[*(long *)(*(long *)piVar29 + -0x18) + 0x20] & 5) == 0 &&
              (uVar39 < 0x14)); uVar39 = uVar39 + 1) {
            std::__cxx11::istringstream::istringstream
                      ((istringstream *)&stoken,(string *)&token,_S_in);
            std::istream::operator>>
                      ((istringstream *)&stoken,
                       (int *)((long)elementsVector.
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[sVar42].
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start + lVar37));
            std::__cxx11::istringstream::~istringstream((istringstream *)&stoken);
            lVar37 = lVar37 + 4;
          }
          piVar6 = elementsVector.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[sVar42].
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start;
          peVar7 = nodesVector.
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)piVar6[2] + -1].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          peVar8 = nodesVector.
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)piVar6[1] + -1].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          peVar9 = nodesVector.
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(long)*piVar6 + -1].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          peVar10 = nodesVector.
                    super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzD>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[(long)piVar6[3] + -1].
                    super___shared_ptr<chrono::fea::ChNodeFEAxyzD,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr;
          puVar1 = &(peVar7->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
          auVar20 = *(undefined1 (*) [16])puVar1;
          auVar19 = *(undefined1 (*) [16])puVar1;
          auVar17 = *(undefined1 (*) [16])puVar1;
          dVar43 = *(double *)&(peVar9->super_ChNodeFEAxyz).field_0x30;
          local_808 = *(double *)&(peVar8->super_ChNodeFEAxyz).field_0x30;
          auVar3 = *(undefined1 (*) [16])
                    &(peVar8->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
          local_748 = *(double *)&(peVar10->super_ChNodeFEAxyz).field_0x30;
          dVar44 = *(double *)&(peVar7->super_ChNodeFEAxyz).field_0x30;
          dVar45 = dVar43 - local_748;
          dVar46 = dVar43 - local_808;
          auVar4 = *(undefined1 (*) [16])
                    &(peVar9->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
          auVar5 = *(undefined1 (*) [16])
                    &(peVar10->super_ChNodeFEAxyz).super_ChNodeFEAbase.field_0x20;
          auVar15 = vsubpd_avx(auVar4,auVar3);
          auVar16 = vsubpd_avx(auVar4,auVar5);
          local_848 = auVar16;
          local_838 = dVar45;
          local_828 = auVar15;
          local_818 = dVar46;
          ChVector<double>::operator%
                    ((ChVector<double> *)&stoken,(ChVector<double> *)local_828,
                     (ChVector<double> *)local_848);
          ChVector<double>::operator+=
                    (Normals.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (long)*elementsVector.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar42].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start + -1,(ChVector<double> *)&stoken);
          auVar17 = vsubpd_avx(auVar3,auVar17);
          dVar18 = local_808 - dVar44;
          num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)*elementsVector.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[sVar42].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + -1] =
               num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(long)*elementsVector.
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar42].
                       super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                       ._M_start + -1] + 1;
          local_838 = local_808 - dVar43;
          local_848 = vsubpd_avx(auVar3,auVar4);
          local_828 = auVar17;
          local_818 = dVar18;
          ChVector<double>::operator%
                    ((ChVector<double> *)&stoken,(ChVector<double> *)local_828,
                     (ChVector<double> *)local_848);
          ChVector<double>::operator+=
                    (Normals.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (long)elementsVector.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar42].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[1] + -1,(ChVector<double> *)&stoken);
          local_828 = vsubpd_avx(auVar5,auVar4);
          local_818 = local_748 - dVar43;
          auVar4 = vsubpd_avx(auVar5,auVar19);
          num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)elementsVector.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar42].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[1] + -1] =
               num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(long)elementsVector.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar42].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[1] + -1] + 1;
          dVar43 = local_748 - dVar44;
          local_848 = auVar4;
          local_838 = dVar43;
          ChVector<double>::operator%
                    ((ChVector<double> *)&stoken,(ChVector<double> *)local_828,
                     (ChVector<double> *)local_848);
          ChVector<double>::operator+=
                    (Normals.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (long)elementsVector.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar42].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[2] + -1,(ChVector<double> *)&stoken);
          local_828 = vsubpd_avx(auVar20,auVar5);
          local_818 = dVar44 - local_748;
          local_848 = vsubpd_avx(auVar20,auVar3);
          num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)elementsVector.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar42].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[2] + -1] =
               num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(long)elementsVector.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar42].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[2] + -1] + 1;
          local_838 = dVar44 - local_808;
          ChVector<double>::operator%
                    ((ChVector<double> *)&stoken,(ChVector<double> *)local_828,
                     (ChVector<double> *)local_848);
          ChVector<double>::operator+=
                    (Normals.
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_start +
                     (long)elementsVector.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[sVar42].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[3] + -1,(ChVector<double> *)&stoken);
          local_5d8 = auVar15._0_8_;
          dStack_5d0 = auVar15._8_8_;
          num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[(long)elementsVector.
                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[sVar42].
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[3] + -1] =
               num_Normals.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start
               [(long)elementsVector.
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[sVar42].
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_start[3] + -1] + 1;
          local_828._0_8_ = local_5d8;
          local_828._8_8_ = dStack_5d0;
          local_7c8 = auVar4._0_8_;
          dStack_7c0 = auVar4._8_8_;
          local_848._0_8_ = local_7c8;
          local_848._8_8_ = dStack_7c0;
          local_838 = dVar43;
          local_818 = dVar46;
          dVar43 = ChVector<double>::Length((ChVector<double> *)local_828);
          dVar44 = ChVector<double>::Length((ChVector<double> *)local_848);
          local_848 = auVar17;
          local_838 = dVar18;
          local_828 = auVar16;
          local_818 = dVar45;
          dVar45 = ChVector<double>::Length((ChVector<double> *)local_828);
          dVar46 = ChVector<double>::Length((ChVector<double> *)local_848);
          pdVar11 = elementsdxdy.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar42].
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          *pdVar11 = (dVar44 + dVar43) * 0.5;
          pdVar11[1] = (dVar46 + dVar45) * 0.5;
          if (uVar39 != 5) {
            pCVar35 = (ChException *)__cxa_allocate_exception(0x28);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,
                           "ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n",
                           &line);
            std::operator+(&local_5b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &stoken,"\n");
            ChException::ChException(pCVar35,&local_5b8);
            __cxa_throw(pCVar35,&ChException::typeinfo,ChException::~ChException);
          }
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&fin,(string *)&line);
          std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
          std::__cxx11::string::~string((string *)&token);
          sVar42 = __new_size;
        }
      }
    }
  } while( true );
}

Assistant:

void ChMeshFileLoader::ANCFShellFromGMFFile(std::shared_ptr<ChMesh> mesh,
                                            const char* filename,
                                            std::shared_ptr<ChMaterialShellANCF> my_material,
                                            std::vector<double>& node_ave_area,
                                            std::vector<int>& Boundary_nodes,
                                            ChVector<> pos_transform,
                                            ChMatrix33<> rot_transform,
                                            double scaleFactor,
                                            bool printNodes,
                                            bool printElements) {
    int added_nodes = 0;
    int added_elements = 0;
    double dx, dy;
    int nodes_offset = mesh->GetNnodes();
    printf("Current number of nodes in mesh is %d \n", nodes_offset);
    ChMatrixDynamic<double> nodesXYZ(1, 4);
    ChMatrixDynamic<int> NumBEdges(1, 3);  // To store boundary nodes
    ChMatrixNM<double, 1, 6> BoundingBox;  // (xmin xmax ymin ymax zmin zmax) bounding box of the mesh
    std::vector<ChVector<>> Normals;       // To store the normal vectors
    std::vector<int> num_Normals;
    ChVector<double> pos1, pos2, pos3, pos4;                  // Position of nodes in each element
    ChVector<double> vec1, vec2, vec3;                        // intermediate vectors for calculation of normals
    std::vector<std::shared_ptr<ChNodeFEAxyzD>> nodesVector;  // To store intermediate nodes
    std::vector<std::vector<int>> elementsVector;             // nodes of each element
    std::vector<std::vector<double>> elementsdxdy;            // dx, dy of elements

    int TotalNumNodes = 0, TotalNumElements = 0, TotalNumBEdges = 0;
    BoundingBox.setZero();

    std::ifstream fin(filename);
    if (!fin.good())
        throw ChException("ERROR opening Mesh file: " + std::string(filename) + "\n");

    std::string line;
    while (std::getline(fin, line)) {
        // trims white space from the beginning of the string
        line.erase(line.begin(),
                   std::find_if(line.begin(), line.end(), [](unsigned char c) { return !std::isspace(c); }));

        if (line[0] == 0)
            continue;  // skip empty linesnodes_offset
        if (line.find("Vertices") == 0) {
            std::getline(fin, line);
            TotalNumNodes = atoi(line.c_str());
            printf("Found  %d nodes\n", TotalNumNodes);
            GetLog() << "Parsing information from \"Vertices\" \n";
            std::getline(fin, line);
            Normals.resize(TotalNumNodes);
            node_ave_area.resize(nodes_offset + TotalNumNodes);
            num_Normals.resize(TotalNumNodes);
            for (int inode = 0; inode < TotalNumNodes; inode++) {
                double loc_x, loc_y, loc_z;
                double dir_x, dir_y, dir_z;

                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> nodesXYZ(0, ntoken);
                    nodesXYZ(0, ntoken) *= scaleFactor;
                    ++ntoken;
                }

                loc_x = nodesXYZ(0, 0);
                loc_y = nodesXYZ(0, 1);
                loc_z = nodesXYZ(0, 2);
                dir_x = 1.0;
                dir_y = 1.0;
                dir_z = 1.0;

                ChVector<> node_position(loc_x, loc_y, loc_z);
                node_position = rot_transform * node_position;  // rotate/scale, if needed
                node_position = pos_transform + node_position;  // move, if needed
                auto node = chrono_types::make_shared<ChNodeFEAxyzD>(node_position, ChVector<>(dir_x, dir_y, dir_z));
                nodesVector.push_back(node);

                if (loc_x < BoundingBox(0, 0) || added_nodes == 0)
                    BoundingBox(0, 0) = loc_x;
                if (loc_x > BoundingBox(0, 1) || added_nodes == 0)
                    BoundingBox(0, 1) = loc_x;
                if (loc_y < BoundingBox(0, 2) || added_nodes == 0)
                    BoundingBox(0, 2) = loc_y;
                if (loc_y > BoundingBox(0, 3) || added_nodes == 0)
                    BoundingBox(0, 3) = loc_y;

                if (loc_z < BoundingBox(0, 4) || added_nodes == 0)
                    BoundingBox(0, 4) = loc_z;
                if (loc_z > BoundingBox(0, 5) || added_nodes == 0)
                    BoundingBox(0, 5) = loc_z;
                ++added_nodes;

                if (ntoken != 4)
                    throw ChException("ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n" + line +
                                      "\n");

                std::getline(fin, line);
            }
        }

        // Reading the Boundary nodes ...
        if (line.find("Edges") == 0) {
            std::getline(fin, line);
            TotalNumBEdges = atoi(line.c_str());
            printf("Found %d Edges.\n", TotalNumBEdges);
            GetLog() << "Parsing edges from \"Edges\" \n";
            std::getline(fin, line);

            for (int edge = 0; edge < TotalNumBEdges; edge++) {
                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> NumBEdges(0, ntoken);
                    ++ntoken;
                }

                if (ntoken != 3)
                    throw ChException("ERROR in .mesh file, Edges require 3 node IDs, see line:\n" + line + "\n");

                std::getline(fin, line);
            }
        }

        //
        if (line.find("Quadrilaterals") == 0) {
            std::getline(fin, line);
            TotalNumElements = atoi(line.c_str());
            printf("Found %d elements.\n", TotalNumElements);
            GetLog() << "Parsing nodeset from \"Quadrilaterals\" \n";
            std::getline(fin, line);

            for (int ele = 0; ele < TotalNumElements; ele++) {
                int ntoken = 0;
                std::string token;
                std::istringstream ss(line);
                elementsVector.resize(ele + 1);
                elementsVector[ele].resize(5);
                elementsdxdy.resize(ele + 1);
                elementsdxdy[ele].resize(2);
                while (std::getline(ss, token, ' ') && ntoken < 20) {
                    std::istringstream stoken(token);
                    stoken >> elementsVector[ele][ntoken];
                    ++ntoken;
                }

                // Calculating the true surface normals based on the nodal information
                pos1 = nodesVector[elementsVector[ele][0] - 1]->GetPos();
                pos2 = nodesVector[elementsVector[ele][1] - 1]->GetPos();
                pos4 = nodesVector[elementsVector[ele][2] - 1]->GetPos();
                pos3 = nodesVector[elementsVector[ele][3] - 1]->GetPos();

                // For the first node
                vec1 = (pos1 - pos2);
                vec2 = (pos1 - pos3);
                Normals[elementsVector[ele][0] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][0] - 1]++;
                // For the second node
                vec1 = (pos2 - pos4);
                vec2 = (pos2 - pos1);
                Normals[elementsVector[ele][1] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][1] - 1]++;
                // For the third node
                vec1 = (pos3 - pos1);
                vec2 = (pos3 - pos4);
                Normals[elementsVector[ele][2] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][2] - 1]++;
                // For the forth node
                vec1 = (pos4 - pos3);
                vec2 = (pos4 - pos2);
                Normals[elementsVector[ele][3] - 1] += vec1 % vec2;
                num_Normals[elementsVector[ele][3] - 1]++;

                vec1 = pos1 - pos2;
                vec2 = pos3 - pos4;
                dx = (vec1.Length() + vec2.Length()) / 2;
                vec1 = pos1 - pos3;
                vec2 = pos2 - pos4;
                dy = (vec1.Length() + vec2.Length()) / 2;

                // Set element dimensions
                elementsdxdy[ele][0] = dx;
                elementsdxdy[ele][1] = dy;
                ++added_elements;
                if (ntoken != 5)
                    throw ChException("ERROR in .mesh file, Quadrilaterals require 4 node IDs, see line:\n" + line +
                                      "\n");
                std::getline(fin, line);
            }
        }
    }

    printf("Mesh Bounding box is x [%f %f %f %f %f %f]\n", BoundingBox(0, 0), BoundingBox(0, 1), BoundingBox(0, 2),
           BoundingBox(0, 3), BoundingBox(0, 4), BoundingBox(0, 5));

    GetLog() << "-----------------------------------------------------------\n\n";
    //
    for (int inode = 0; inode < TotalNumNodes; inode++) {
        ChVector<> node_normal = (Normals[inode] / num_Normals[inode]);
        // Very useful information to store: 1/4 of area of neighbouring elements contribute to each node's average area
        node_ave_area[nodes_offset + inode] = Normals[inode].Length() / 4;

        if (num_Normals[inode] <= 2)
            Boundary_nodes.push_back(nodes_offset + inode);
        node_normal.Normalize();

        ChVector<> node_position = nodesVector[inode]->GetPos();
        auto node = chrono_types::make_shared<ChNodeFEAxyzD>(node_position, node_normal);
        node->SetMass(0);
        // Add node to mesh
        mesh->AddNode(node);
        if (printNodes) {
            GetLog() << node->GetPos().x() << "  " << node->GetPos().y() << "  " << node->GetPos().z() << "\n";
        }
    }
    GetLog() << "-----------------------------------------------------------\n";
    for (int ielem = 0; ielem < 0 + TotalNumElements; ielem++) {
        auto element = chrono_types::make_shared<ChElementShellANCF_3423>();
        element->SetNodes(
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][0] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][1] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][2] - 1)),
            std::dynamic_pointer_cast<ChNodeFEAxyzD>(mesh->GetNode(nodes_offset + elementsVector[ielem][3] - 1)));
        dx = elementsdxdy[ielem][0];
        dy = elementsdxdy[ielem][1];
        element->SetDimensions(dx, dy);
        // Add element to mesh
        mesh->AddElement(element);
        if (printElements) {
            std::cout << ielem << " ";
            for (int i = 0; i < 4; i++)
                std::cout << elementsVector[ielem][i] << " ";
            std::cout << std::endl;
        }
    }
}